

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestEventListener * __thiscall
testing::internal::TestEventRepeater::Release(TestEventRepeater *this,TestEventListener *listener)

{
  long lVar1;
  const_iterator __position;
  bool bVar2;
  
  __position._M_current =
       (this->listeners_).
       super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(this->listeners_).
                super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current >> 3;
  while( true ) {
    bVar2 = lVar1 == 0;
    lVar1 = lVar1 + -1;
    if (bVar2) {
      return (TestEventListener *)0x0;
    }
    if (*__position._M_current == listener) break;
    __position._M_current = __position._M_current + 1;
  }
  std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>::erase
            (&this->listeners_,__position);
  return listener;
}

Assistant:

TestEventListener* TestEventRepeater::Release(TestEventListener *listener) {
  for (size_t i = 0; i < listeners_.size(); ++i) {
    if (listeners_[i] == listener) {
      listeners_.erase(listeners_.begin() + i);
      return listener;
    }
  }

  return NULL;
}